

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::Texture2DShadowCase::init(Texture2DShadowCase *this,EVP_PKEY_CTX *ctx)

{
  vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *this_00;
  deUint32 dVar1;
  int iVar2;
  int extraout_EAX;
  Texture2D *pTVar3;
  RenderTarget *pRVar4;
  ulong uVar5;
  pointer ppTVar6;
  int iVar7;
  ulong uVar8;
  PixelBufferAccess *access;
  int levelNdx;
  uint uVar9;
  long lVar10;
  float fVar11;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Vec2 local_140;
  Vec2 local_138;
  float local_12c;
  long local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  float afStack_110 [2];
  Vec4 local_108;
  undefined8 uStack_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  uint local_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined8 local_a4;
  undefined8 uStack_9c;
  undefined8 local_94;
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined4 local_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  FilterCase local_58;
  
  this_00 = &this->m_textures;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,2);
  pTVar3 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (pTVar3,((this->super_TestCase).m_context)->m_renderCtx,this->m_format,this->m_width,
             this->m_height);
  local_108.m_data._0_8_ = pTVar3;
  std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
            ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
             (Texture2D **)&local_108);
  pTVar3 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (pTVar3,((this->super_TestCase).m_context)->m_renderCtx,this->m_format,this->m_width,
             this->m_height);
  local_108.m_data._0_8_ = pTVar3;
  std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
            ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
             (Texture2D **)&local_108);
  pTVar3 = *(this_00->super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_118 = ((long)(pTVar3->m_refTexture).super_TextureLevelPyramid.m_access.
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              *(long *)&(pTVar3->m_refTexture).super_TextureLevelPyramid.m_access.
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl) / 0x28;
  lVar10 = 0;
  uVar5 = 0;
  if (0 < (int)local_118) {
    uVar5 = local_118 & 0xffffffff;
  }
  for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
    tcu::Texture2D::allocLevel
              (&(*(this_00->super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start)->m_refTexture,(int)uVar8);
    local_108.m_data._0_8_ = (Texture2D *)0xbf000000bf000000;
    local_108.m_data[2] = -0.5;
    local_108.m_data[3] = 2.0;
    local_58.texture = (Texture2D *)0x3f8000003f800000;
    local_58.minCoord.m_data[0] = 1.0;
    local_58.minCoord.m_data[1] = 0.0;
    tcu::fillWithComponentGradients
              ((PixelBufferAccess *)
               (*(long *)&((*(this_00->
                             super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                             )._M_impl.super__Vector_impl_data._M_start)->m_refTexture).
                          super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl + lVar10),&local_108,(Vec4 *)&local_58);
    lVar10 = lVar10 + 0x28;
  }
  local_128 = 0;
  for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
    lVar10 = (long)(int)(float)local_118;
    tcu::Texture2D::allocLevel
              (&(this_00->super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                _M_impl.super__Vector_impl_data._M_start[1]->m_refTexture,(int)uVar8);
    uVar9 = (int)(0xffffff / lVar10) * (int)uVar8;
    access = (PixelBufferAccess *)
             (*(long *)&((this_00->
                         super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[1]->m_refTexture).
                        super_TextureLevelPyramid.m_access.
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl + local_128);
    local_138.m_data = (float  [2])(CONCAT44(local_138.m_data[1],uVar9) | 0xff000000);
    tcu::RGBA::toVec((RGBA *)&local_138);
    local_140.m_data = (float  [2])(CONCAT44(local_140.m_data[1],~uVar9) | 0xff000000);
    tcu::RGBA::toVec((RGBA *)&local_140);
    tcu::fillWithGrid(access,4,&local_108,(Vec4 *)&local_58);
    local_128 = local_128 + 0x28;
  }
  for (ppTVar6 = (this->m_textures).
                 super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppTVar6 !=
      (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppTVar6 = ppTVar6 + 1) {
    (*(*ppTVar6)->_vptr_Texture2D[2])();
  }
  dVar1 = this->m_compareFunc;
  if (dVar1 == 0x205 || dVar1 == 0x202) {
    local_d4 = 0x3f800000;
  }
  else {
    local_d4 = 0x3f000000;
  }
  local_ec = 0;
  if (dVar1 != 0x205 && dVar1 != 0x202) {
    local_ec = 0x3f000000;
  }
  local_108.m_data._0_8_ = (ulong)local_d4 << 0x20;
  local_108.m_data[2] = 1.6;
  local_108.m_data[3] = 2.9;
  uStack_f8 = 0xc02ccccdbf800000;
  local_f0 = 0;
  local_e8 = 0xbfaccccdc0000000;
  uStack_e0 = 0x3f333333be4ccccd;
  local_d8 = 1;
  local_d0 = 0x3e8ccccd3e0f5c29;
  uStack_c8 = 0xbf8ccccdbfc00000;
  local_b8 = 0xc028f5c3bf6b851f;
  uStack_b0 = 0xbdcccccd3ecccccd;
  local_a4 = 0xbec7ae143f8ccccd;
  uStack_9c = 0x3f266666bf051eb8;
  local_94 = 0x13f5eb852;
  local_8c = 0xbfc66666bdcccccd;
  uStack_84 = 0x3eb333333f266666;
  local_7c = 0x3f68f5c3;
  local_c0 = local_d8;
  local_bc = local_ec;
  local_a8 = local_d8;
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_128._0_4_ = (float)pRVar4->m_width;
  local_128._4_4_ = pRVar4->m_height;
  uStack_120._0_4_ = (pRVar4->m_pixelFormat).redBits;
  uStack_120._4_4_ = (pRVar4->m_pixelFormat).greenBits;
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar9 = -(uint)(pRVar4->m_height < 0x40);
  local_78 = (float)(int)(~-(uint)((int)(float)local_128 < 0x40) & 0x40 |
                         (uint)(float)local_128 & -(uint)((int)(float)local_128 < 0x40));
  fStack_74 = (float)(int)(~uVar9 & 0x40 | pRVar4->m_height & uVar9);
  fStack_70 = (float)(int)((uint)uStack_120 & -(uint)((int)(uint)uStack_120 < 0));
  fStack_6c = (float)(int)(uStack_120._4_4_ & -(uint)(uStack_120 < 0));
  for (lVar10 = 0x10; lVar10 != 0xa0; lVar10 = lVar10 + 0x18) {
    iVar2 = *(int *)((long)afStack_110 + lVar10 + -8);
    iVar7 = (int)((ulong)((long)(this->m_textures).
                                super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_textures).
                               super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    if (iVar2 < iVar7) {
      iVar7 = iVar2;
    }
    if (iVar2 < 0) {
      iVar7 = 0;
    }
    local_128 = CONCAT44(local_128._4_4_,*(undefined4 *)((long)afStack_110 + lVar10 + -4));
    local_12c = *(float *)((long)afStack_110 + lVar10 + 4);
    fVar11 = deFloatExp2(*(float *)((long)afStack_110 + lVar10));
    local_118 = CONCAT44(extraout_XMM0_Db,fVar11);
    local_68 = ZEXT416((uint)((this->m_textures).
                              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar7]->m_refTexture).
                             m_width);
    fVar11 = deFloatExp2(local_12c);
    pTVar3 = (this->m_textures).
             super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar7];
    local_138.m_data = *(float (*) [2])((long)&local_108 + lVar10);
    auVar12._0_4_ = (float)local_118 * local_78;
    auVar12._4_4_ = fVar11 * fStack_74;
    auVar12._8_4_ = local_118._4_4_ * fStack_70;
    auVar12._12_4_ = extraout_XMM0_Db_00 * fStack_6c;
    auVar13._0_4_ = (float)(int)local_68._0_4_;
    auVar13._4_4_ = (float)(pTVar3->m_refTexture).m_height;
    auVar13._8_4_ = (float)(int)local_68._4_4_;
    auVar13._12_4_ = 0;
    auVar13 = divps(auVar12,auVar13);
    local_140.m_data[0] = auVar13._0_4_ + local_138.m_data[0];
    local_140.m_data[1] = auVar13._4_4_ + local_138.m_data[1];
    FilterCase::FilterCase(&local_58,pTVar3,(float)local_128,&local_138,&local_140);
    std::
    vector<deqp::gles3::Functional::Texture2DShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>_>
    ::emplace_back<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>
              (&this->m_cases,&local_58);
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void Texture2DShadowCase::init (void)
{
	try
	{
		// Create 2 textures.
		m_textures.reserve(2);
		m_textures.push_back(new glu::Texture2D(m_context.getRenderContext(), m_format, m_width, m_height));
		m_textures.push_back(new glu::Texture2D(m_context.getRenderContext(), m_format, m_width, m_height));

		int numLevels = m_textures[0]->getRefTexture().getNumLevels();

		// Fill first gradient texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_textures[0]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f));
		}

		// Fill second with grid texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step	= 0x00ffffff / numLevels;
			deUint32	rgb		= step*levelNdx;
			deUint32	colorA	= 0xff000000 | rgb;
			deUint32	colorB	= 0xff000000 | ~rgb;

			m_textures[1]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec(), tcu::RGBA(colorB).toVec());
		}

		// Upload.
		for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
			(*i)->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		Texture2DShadowCase::deinit();
		throw;
	}

	// Compute cases.
	{
		const float refInRangeUpper		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 1.0f : 0.5f;
		const float refInRangeLower		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 0.0f : 0.5f;
		const float refOutOfBoundsUpper	= 1.1f;		// !< lookup function should clamp values to [0, 1] range
		const float refOutOfBoundsLower	= -0.1f;

		const struct
		{
			int		texNdx;
			float	ref;
			float	lodX;
			float	lodY;
			float	oX;
			float	oY;
		} cases[] =
		{
			{ 0,	refInRangeUpper,		1.6f,	2.9f,	-1.0f,	-2.7f	},
			{ 0,	refInRangeLower,		-2.0f,	-1.35f,	-0.2f,	0.7f	},
			{ 1,	refInRangeUpper,		0.14f,	0.275f,	-1.5f,	-1.1f	},
			{ 1,	refInRangeLower,		-0.92f,	-2.64f,	0.4f,	-0.1f	},
			{ 1,	refOutOfBoundsUpper,	-0.39f,	-0.52f,	0.65f,	0.87f	},
			{ 1,	refOutOfBoundsLower,	-1.55f,	0.65f,	0.35f,	0.91f	},
		};

		const float	viewportW	= (float)de::min<int>(TEX2D_VIEWPORT_WIDTH, m_context.getRenderTarget().getWidth());
		const float	viewportH	= (float)de::min<int>(TEX2D_VIEWPORT_HEIGHT, m_context.getRenderTarget().getHeight());

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		{
			const int	texNdx	= de::clamp(cases[caseNdx].texNdx, 0, (int)m_textures.size()-1);
			const float ref		= cases[caseNdx].ref;
			const float	lodX	= cases[caseNdx].lodX;
			const float	lodY	= cases[caseNdx].lodY;
			const float	oX		= cases[caseNdx].oX;
			const float	oY		= cases[caseNdx].oY;
			const float	sX		= deFloatExp2(lodX)*viewportW / float(m_textures[texNdx]->getRefTexture().getWidth());
			const float	sY		= deFloatExp2(lodY)*viewportH / float(m_textures[texNdx]->getRefTexture().getHeight());

			m_cases.push_back(FilterCase(m_textures[texNdx], ref, tcu::Vec2(oX, oY), tcu::Vec2(oX+sX, oY+sY)));
		}
	}

	m_caseNdx = 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}